

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

bool __thiscall CompoundFile::File::hasDirectory(File *this,wstring *name)

{
  __type _Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = &(this->m_dirs)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var2; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)&p_Var3[1]._M_parent,name);
    if (_Var1) break;
  }
  return (_Rb_tree_header *)p_Var3 != p_Var2;
}

Assistant:

inline bool
File::hasDirectory( const std::wstring & name ) const
{
	for( std::map< int32_t, Directory >::const_iterator it = m_dirs.begin(),
		last = m_dirs.end(); it != last; ++it )
	{
		if ( it->second.name() == name )
			return true;
	}

	return false;
}